

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBlob.cpp
# Opt level: O1

bool __thiscall jbcoin::STBlob::isEquivalent(STBlob *this,STBase *t)

{
  size_t __n;
  int iVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  lVar2 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    __n = (this->value_).size_;
    if (__n == *(size_t *)(lVar2 + 0x18)) {
      iVar1 = bcmp((this->value_).p_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                   *(void **)(lVar2 + 0x10),__n);
      bVar3 = iVar1 == 0;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool
STBlob::isEquivalent (const STBase& t) const
{
    const STBlob* v = dynamic_cast<const STBlob*> (&t);
    return v && (value_ == v->value_);
}